

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

void roaring64_bitmap_and_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  ulong uVar1;
  int *c1;
  art_val_t *paVar2;
  int iVar3;
  ulong uVar4;
  int *c;
  int *piVar5;
  long lVar6;
  byte bVar7;
  uint8_t typecode2;
  leaf_t leaf;
  art_iterator_t it2;
  art_iterator_t it1;
  byte local_169 [9];
  int *local_160;
  roaring64_bitmap_t *local_158;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  if (r1 != r2) {
    art_init_iterator(&local_c0,&r1->art,true);
    art_init_iterator(&local_150,&r2->art,true);
    if (local_c0.value != (ulong *)0x0) {
      local_158 = r2;
      do {
        if (local_150.value == (ulong *)0x0) {
LAB_001071b1:
          art_iterator_erase(&local_c0,(art_val_t *)&local_160);
          container_free(r1->containers[(ulong)local_160 >> 8],(uint8_t)local_160);
          uVar4 = (ulong)local_160 >> 8;
          r1->containers[uVar4] = (container_t *)0x0;
          if (uVar4 < r1->first_free) {
            r1->first_free = uVar4;
          }
        }
        else {
          iVar3 = art_compare_keys(local_c0.key,local_150.key);
          paVar2 = local_c0.value;
          if (iVar3 == 0) {
            uVar4 = *local_150.value;
            uVar1 = *local_c0.value;
            c1 = (int *)r1->containers[uVar1 >> 8];
            if ((char)uVar1 != '\x04') {
              if ((uint8_t)uVar4 == '\x04') {
                uVar4 = (ulong)*(byte *)((long)r2->containers[uVar4 >> 8] + 8);
              }
              local_169[1] = 0;
              local_169[2] = 0;
              local_169[3] = 0;
              local_169[4] = 0;
              local_169[5] = 0;
              local_169[6] = 0;
              local_169[7] = 0;
              local_169[8] = 0;
              local_160 = c1;
              (*(code *)(&DAT_0012f590 +
                        *(int *)(&DAT_0012f590 +
                                (ulong)((((uint)uVar4 & 0xff) + ((uint)uVar1 & 0xff) * 4) - 5) * 4))
              )();
              return;
            }
            c = (int *)container_and(c1,'\x04',r2->containers[uVar4 >> 8],(uint8_t)uVar4,local_169);
            if (c != c1) {
              container_free(c1,'\x04');
            }
            piVar5 = c;
            bVar7 = local_169[0];
            if ((ulong)local_169[0] == 4) {
              bVar7 = *(byte *)(c + 2);
              piVar5 = *(int **)c;
            }
            iVar3 = *piVar5;
            if ((bVar7 == 3) || (bVar7 == 2)) {
              if (iVar3 < 1) goto LAB_00107400;
LAB_00107447:
              if (c != c1) {
                uVar4 = *paVar2;
                r1->containers[uVar4 >> 8] = c;
                *paVar2 = uVar4 & 0xffffffffffffff00 | (ulong)local_169[0];
              }
              art_iterator_next(&local_c0);
            }
            else {
              if (iVar3 != 0) {
                if (iVar3 != -1) goto LAB_00107447;
                lVar6 = 0;
                do {
                  if (*(long *)(*(long *)(piVar5 + 2) + lVar6 * 8) != 0) goto LAB_00107447;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 0x400);
              }
LAB_00107400:
              container_free(c,local_169[0]);
              art_iterator_erase(&local_c0,(art_val_t *)0x0);
              uVar4 = *paVar2 >> 8;
              r1->containers[uVar4] = (container_t *)0x0;
              if (uVar4 < r1->first_free) {
                r1->first_free = uVar4;
              }
            }
            art_iterator_next(&local_150);
            r2 = local_158;
          }
          else {
            if (iVar3 < 0) goto LAB_001071b1;
            art_iterator_lower_bound(&local_150,local_c0.key);
          }
        }
      } while (local_c0.value != (ulong *)0x0);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_and_inplace(roaring64_bitmap_t *r1,
                                  const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. !it2_present -> erase it1
        // 2. it2_present
        //    a. it1 <  it2 -> erase it1
        //    b. it1 == it2 -> output it1 & it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2a: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;

                // We do the computation "in place" only when c1 is not a
                // shared container. Rationale: using a shared container
                // safely with in place computation would require making a
                // copy and then doing the computation in place which is
                // likely less efficient than avoiding in place entirely and
                // always generating a new container.
                uint8_t typecode = get_typecode(*leaf1);
                container_t *container = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_and(container, typecode,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_iand(
                        container, typecode, get_container(r2, leaf2),
                        get_typecode(leaf2), &typecode2);
                }

                if (container2 != container) {
                    container_free(container, typecode);
                }
                if (!container_nonzero_cardinality(container2, typecode2)) {
                    container_free(container2, typecode2);
                    art_iterator_erase(&it1, NULL);
                    remove_container(r1, *leaf1);
                } else {
                    if (container2 != container) {
                        replace_container(r1, leaf1, container2, typecode2);
                    }
                    // Only advance the iterator if we didn't delete the
                    // leaf, as erasing advances by itself.
                    art_iterator_next(&it1);
                }
                art_iterator_next(&it2);
            }
        }

        if (!it2_present || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t leaf;
            bool erased = art_iterator_erase(&it1, (art_val_t *)&leaf);
            assert(erased);
            container_free(get_container(r1, leaf), get_typecode(leaf));
            remove_container(r1, leaf);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_lower_bound(&it2, it1.key);
        }
    }
}